

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gym_Emu.cpp
# Opt level: O0

void __thiscall Gym_Emu::play_frame(Gym_Emu *this)

{
  sample_t_conflict1 *in_stack_00000010;
  int in_stack_00000018;
  blip_time_t in_stack_0000001c;
  Gym_Emu *in_stack_00000020;
  
  play_frame(in_stack_00000020,in_stack_0000001c,in_stack_00000018,in_stack_00000010);
  return;
}

Assistant:

int Gym_Emu::play_frame( blip_time_t blip_time, int sample_count, sample_t* buf )
{
	if ( !track_ended() )
		parse_frame();
	
	apu.end_frame( blip_time );
	
	memset( buf, 0, sample_count * sizeof *buf );
	fm.run( sample_count >> 1, buf );
	
	return sample_count;
}